

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult SetMaxWidth(ShellState *state,char **azArg,idx_t nArg)

{
  sqlite3_int64 sVar1;
  ulong in_RDX;
  char *in_RDI;
  MetadataResult local_1;
  
  if (in_RDX < 3) {
    if (in_RDX == 1) {
      fprintf(*(FILE **)(in_RDI + 0x20),"current max rows: %zu\n",*(undefined8 *)(in_RDI + 0x178));
    }
    else {
      sVar1 = integerValue(in_RDI);
      *(sqlite3_int64 *)(in_RDI + 0x178) = sVar1;
    }
    local_1 = SUCCESS;
  }
  else {
    local_1 = PRINT_USAGE;
  }
  return local_1;
}

Assistant:

MetadataResult SetMaxWidth(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg > 2) {
		return MetadataResult::PRINT_USAGE;
	}
	if (nArg == 1) {
		raw_printf(state.out, "current max rows: %zu\n", state.max_width);
	} else {
		state.max_width = (size_t)integerValue(azArg[1]);
	}
	return MetadataResult::SUCCESS;
}